

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O1

void olsrv2_routing_domain_changed(nhdp_domain *domain,_Bool autoupdate_ansn)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  
  _update_ansn = _update_ansn || autoupdate_ansn;
  if (domain == (nhdp_domain *)0x0) {
    plVar1 = nhdp_domain_get_list();
    plVar3 = plVar1->next;
    plVar1 = plVar3->prev;
    plVar2 = nhdp_domain_get_list();
    if (plVar1 != plVar2->prev) {
      do {
        _domain_changed[*(int *)((long)&plVar3[-0x27].next + 4)] = true;
        olsrv2_routing_trigger_update();
        plVar3 = plVar3->next;
        plVar1 = plVar3->prev;
        plVar2 = nhdp_domain_get_list();
      } while (plVar1 != plVar2->prev);
    }
    return;
  }
  _domain_changed[domain->index] = true;
  olsrv2_routing_trigger_update();
  return;
}

Assistant:

void
olsrv2_routing_domain_changed(struct nhdp_domain *domain, bool autoupdate_ansn) {
  _update_ansn |= autoupdate_ansn;
  if (domain) {
    _domain_changed[domain->index] = true;

    olsrv2_routing_trigger_update();
    return;
  }

  list_for_each_element(nhdp_domain_get_list(), domain, _node) {
    olsrv2_routing_domain_changed(domain, false);
  }
}